

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

ExpandMacroResult
cmCMakePresetsGraphInternal::ExpandMacros
          (string *out,MacroExpanderVector *macroExpanders,int version)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  ExpandMacroResult EVar5;
  string *psVar6;
  size_type sVar7;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  string macroNamespace;
  string result;
  string local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  string local_88;
  int local_64;
  string local_60;
  string *local_40;
  MacroExpanderVector *local_38;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  EVar5 = Ok;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  sVar2 = out->_M_string_length;
  local_64 = version;
  local_38 = macroExpanders;
  if (sVar2 != 0) {
    pcVar3 = (out->_M_dataplus)._M_p;
    sVar7 = 0;
    local_40 = out;
    do {
      cVar1 = pcVar3[sVar7];
      if (EVar5 == Error) {
        if (cVar1 == '}') {
          EVar5 = ExpandMacro(&local_88,&local_b8,&local_60,local_38,local_64);
          if (EVar5 != Ok) goto LAB_002643ad;
          local_b8._M_string_length = 0;
          *local_b8._M_dataplus._M_p = '\0';
          psVar6 = &local_60;
LAB_002641f5:
          psVar6->_M_string_length = 0;
          *(psVar6->_M_dataplus)._M_p = '\0';
          EVar5 = Ok;
        }
        else {
          EVar5 = Error;
          std::__cxx11::string::push_back((char)&local_60);
        }
      }
      else if (EVar5 == Ignore) {
        if (cVar1 == '{') {
          iVar4 = std::__cxx11::string::compare((char *)&local_b8);
          EVar5 = Error;
          if ((((iVar4 != 0) &&
               (iVar4 = std::__cxx11::string::compare((char *)&local_b8), iVar4 != 0)) &&
              (iVar4 = std::__cxx11::string::compare((char *)&local_b8), iVar4 != 0)) &&
             (iVar4 = std::__cxx11::string::compare((char *)&local_b8), iVar4 != 0)) {
            std::__cxx11::string::push_back((char)&local_88);
            std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_b8._M_dataplus._M_p);
            std::__cxx11::string::push_back((char)&local_88);
            psVar6 = &local_b8;
            goto LAB_002641f5;
          }
        }
        else {
          std::__cxx11::string::push_back((char)&local_b8);
          local_98._M_len = 0;
          local_98._M_str = "";
          __str._M_str = local_b8._M_dataplus._M_p;
          __str._M_len = local_b8._M_string_length;
          iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            (&local_98,0,local_b8._M_string_length,__str);
          EVar5 = Ignore;
          if (iVar4 != 0) {
            local_98._M_len = 3;
            local_98._M_str = "env";
            __str_00._M_str = local_b8._M_dataplus._M_p;
            __str_00._M_len = local_b8._M_string_length;
            iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              (&local_98,0,local_b8._M_string_length,__str_00);
            if (iVar4 != 0) {
              local_98._M_len = 4;
              local_98._M_str = "penv";
              __str_01._M_str = local_b8._M_dataplus._M_p;
              __str_01._M_len = local_b8._M_string_length;
              iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                (&local_98,0,local_b8._M_string_length,__str_01);
              if (iVar4 != 0) {
                local_98._M_len = 6;
                local_98._M_str = "vendor";
                __str_02._M_str = local_b8._M_dataplus._M_p;
                __str_02._M_len = local_b8._M_string_length;
                iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  (&local_98,0,local_b8._M_string_length,__str_02);
                if (iVar4 != 0) {
                  std::__cxx11::string::push_back((char)&local_88);
                  std::__cxx11::string::_M_append
                            ((char *)&local_88,(ulong)local_b8._M_dataplus._M_p);
                  psVar6 = &local_b8;
                  goto LAB_002641f5;
                }
              }
            }
          }
        }
      }
      else {
        EVar5 = Ignore;
        if (cVar1 != '$') {
          EVar5 = Ok;
          std::__cxx11::string::push_back((char)&local_88);
        }
      }
      out = local_40;
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
    if (EVar5 == Error) goto LAB_002643ad;
    if (EVar5 == Ignore) {
      std::__cxx11::string::push_back((char)&local_88);
      std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_b8._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::operator=((string *)out,(string *)&local_88);
  EVar5 = Ok;
LAB_002643ad:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return EVar5;
}

Assistant:

ExpandMacroResult cmCMakePresetsGraphInternal::ExpandMacros(
  std::string& out, MacroExpanderVector const& macroExpanders, int version)
{
  std::string result;
  std::string macroNamespace;
  std::string macroName;

  enum class State
  {
    Default,
    MacroNamespace,
    MacroName,
  } state = State::Default;

  for (auto c : out) {
    switch (state) {
      case State::Default:
        if (c == '$') {
          state = State::MacroNamespace;
        } else {
          result += c;
        }
        break;

      case State::MacroNamespace:
        if (c == '{') {
          if (IsValidMacroNamespace(macroNamespace)) {
            state = State::MacroName;
          } else {
            result += '$';
            result += macroNamespace;
            result += '{';
            macroNamespace.clear();
            state = State::Default;
          }
        } else {
          macroNamespace += c;
          if (!PrefixesValidMacroNamespace(macroNamespace)) {
            result += '$';
            result += macroNamespace;
            macroNamespace.clear();
            state = State::Default;
          }
        }
        break;

      case State::MacroName:
        if (c == '}') {
          auto e = ExpandMacro(result, macroNamespace, macroName,
                               macroExpanders, version);
          if (e != ExpandMacroResult::Ok) {
            return e;
          }
          macroNamespace.clear();
          macroName.clear();
          state = State::Default;
        } else {
          macroName += c;
        }
        break;
    }
  }

  switch (state) {
    case State::Default:
      break;
    case State::MacroNamespace:
      result += '$';
      result += macroNamespace;
      break;
    case State::MacroName:
      return ExpandMacroResult::Error;
  }

  out = std::move(result);
  return ExpandMacroResult::Ok;
}